

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fspec.cc
# Opt level: O2

void __thiscall
ProtoStoreInternal::restoreXml(ProtoStoreInternal *this,Element *el,ProtoModel *model)

{
  Architecture *manage;
  Element *pEVar1;
  pointer pbVar2;
  pointer ppEVar3;
  AddrSpace *pAVar4;
  pointer pPVar5;
  bool bVar6;
  bool bVar7;
  bool __x;
  bool __x_00;
  int iVar8;
  undefined4 extraout_var;
  Datatype *pDVar9;
  undefined4 extraout_var_00;
  long *plVar10;
  undefined4 extraout_var_02;
  LowlevelError *this_00;
  uint uVar11;
  pointer ppEVar12;
  long lVar13;
  uint uVar14;
  int4 i;
  long lVar15;
  int4 i_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  ulong uVar16;
  size_type __n;
  reference rVar17;
  uint local_134;
  vector<ParameterPieces,_std::allocator<ParameterPieces>_> pieces;
  string name;
  vector<bool,_std::allocator<bool>_> typelocklist;
  vector<bool,_std::allocator<bool>_> namelocklist;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  namelist;
  ParameterPieces local_58;
  undefined4 extraout_var_01;
  
  bVar6 = std::operator!=(&el->name,"internallist");
  if (bVar6) {
    this_00 = (LowlevelError *)__cxa_allocate_exception(0x20);
    std::__cxx11::string::string
              ((string *)&typelocklist,
               "Mismatched ProtoStore tag: ProtoStoreInternal did not get <internallist>",
               (allocator *)&namelocklist);
    LowlevelError::LowlevelError(this_00,(string *)&typelocklist);
    __cxa_throw(this_00,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
  }
  manage = model->glb;
  pieces.super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  namelist.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  typelocklist.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  typelocklist.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  typelocklist.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
  .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  typelocklist.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
  .super__Bit_iterator_base._M_offset = 0;
  typelocklist.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  namelocklist.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  namelocklist.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  namelocklist.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
  .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  namelocklist.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
  .super__Bit_iterator_base._M_offset = 0;
  pieces.super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  pieces.super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  namelocklist.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  namelist.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  namelist.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  name.field_2._M_allocated_capacity = 0;
  name.field_2._8_8_ = 0;
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length = 0;
  std::vector<ParameterPieces,_std::allocator<ParameterPieces>_>::emplace_back<ParameterPieces>
            (&pieces,(ParameterPieces *)&name);
  std::__cxx11::string::string((string *)&name,"ret",(allocator *)&local_58);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&namelist,&name);
  std::__cxx11::string::~string((string *)&name);
  iVar8 = (*this->outparam->_vptr_ProtoParameter[6])();
  std::vector<bool,_std::allocator<bool>_>::push_back(&typelocklist,SUB41(iVar8,0));
  std::vector<bool,_std::allocator<bool>_>::push_back(&namelocklist,false);
  iVar8 = (*this->outparam->_vptr_ProtoParameter[3])();
  pieces.super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>._M_impl.
  super__Vector_impl_data._M_finish[-1].type = (Datatype *)CONCAT44(extraout_var,iVar8);
  pieces.super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>._M_impl.
  super__Vector_impl_data._M_finish[-1].flags = 0;
  iVar8 = (*this->outparam->_vptr_ProtoParameter[9])();
  if ((char)iVar8 != '\0') {
    pieces.super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>._M_impl.
    super__Vector_impl_data._M_finish[-1].flags =
         pieces.super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>._M_impl.
         super__Vector_impl_data._M_finish[-1].flags | 0x10000000;
  }
  (*this->outparam->_vptr_ProtoParameter[4])(&name);
  bVar6 = name._M_dataplus._M_p != (pointer)0x0;
  ppEVar12 = (el->children).super__Vector_base<Element_*,_std::allocator<Element_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  do {
    if (ppEVar12 ==
        (el->children).super__Vector_base<Element_*,_std::allocator<Element_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      if (!bVar6) {
        name.field_2._M_allocated_capacity = 0;
        name._M_dataplus._M_p = (pointer)0x0;
        name._M_string_length = 0;
        lVar13 = 0x10;
        for (uVar16 = 0;
            uVar16 < (ulong)((long)pieces.
                                   super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)pieces.
                                   super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5);
            uVar16 = uVar16 + 1) {
          std::vector<Datatype_*,_std::allocator<Datatype_*>_>::push_back
                    ((vector<Datatype_*,_std::allocator<Datatype_*>_> *)&name,
                     (value_type *)
                     ((long)&((pieces.
                               super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>
                               ._M_impl.super__Vector_impl_data._M_start)->addr).base + lVar13));
          lVar13 = lVar13 + 0x20;
        }
        if (pieces.super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            pieces.super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>._M_impl.
            super__Vector_impl_data._M_start) {
          pieces.super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>._M_impl.
          super__Vector_impl_data._M_finish =
               pieces.super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
        ProtoModel::assignParameterStorage
                  (model,(vector<Datatype_*,_std::allocator<Datatype_*>_> *)&name,&pieces,true);
        if (((pieces.super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>._M_impl.
              super__Vector_impl_data._M_start)->addr).base == (AddrSpace *)0x0) {
          rVar17 = std::vector<bool,_std::allocator<bool>_>::operator[](&typelocklist,0);
          *rVar17._M_p = *rVar17._M_p & ~rVar17._M_mask;
        }
        iVar8 = (*(this->super_ProtoStore)._vptr_ProtoStore[7])();
        rVar17 = std::vector<bool,_std::allocator<bool>_>::operator[](&typelocklist,0);
        (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar8) + 0x60))
                  ((long *)CONCAT44(extraout_var_00,iVar8),(*rVar17._M_p & rVar17._M_mask) != 0);
        std::_Vector_base<Datatype_*,_std::allocator<Datatype_*>_>::~_Vector_base
                  ((_Vector_base<Datatype_*,_std::allocator<Datatype_*>_> *)&name);
      }
      __n = 1;
      uVar11 = 0;
      while( true ) {
        uVar14 = uVar11 + 1;
        uVar16 = (ulong)uVar14;
        if ((ulong)((long)pieces.
                          super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)pieces.
                          super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 5) <= uVar16) break;
        if ((pieces.super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>._M_impl.
             super__Vector_impl_data._M_start[uVar16].flags & 0x20000000) == 0) {
          iVar8 = (*(this->super_ProtoStore)._vptr_ProtoStore[2])
                            (this,(ulong)uVar11,
                             namelist.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + __n,
                             pieces.
                             super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>.
                             _M_impl.super__Vector_impl_data._M_start + uVar16);
          plVar10 = (long *)CONCAT44(extraout_var_01,iVar8);
          rVar17 = std::vector<bool,_std::allocator<bool>_>::operator[](&typelocklist,__n);
          (**(code **)(*plVar10 + 0x60))(plVar10,(*rVar17._M_p & rVar17._M_mask) != 0);
          rVar17 = std::vector<bool,_std::allocator<bool>_>::operator[](&namelocklist,__n);
          (**(code **)(*plVar10 + 0x68))(plVar10,(*rVar17._M_p & rVar17._M_mask) != 0);
          __n = (size_type)((int)__n + 1);
          uVar11 = uVar14;
        }
        else {
          std::__cxx11::string::string((string *)&name,"rethidden",(allocator *)&local_58);
          iVar8 = (*(this->super_ProtoStore)._vptr_ProtoStore[2])
                            (this,(ulong)uVar11,&name,
                             pieces.
                             super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>.
                             _M_impl.super__Vector_impl_data._M_start + uVar16);
          std::__cxx11::string::~string((string *)&name);
          rVar17 = std::vector<bool,_std::allocator<bool>_>::operator[](&typelocklist,0);
          (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar8) + 0x60))
                    ((long *)CONCAT44(extraout_var_02,iVar8),(*rVar17._M_p & rVar17._M_mask) != 0);
          uVar11 = uVar14;
        }
      }
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                (&namelocklist.super__Bvector_base<std::allocator<bool>_>);
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                (&typelocklist.super__Bvector_base<std::allocator<bool>_>);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&namelist);
      std::_Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>::~_Vector_base
                (&pieces.super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>);
      return;
    }
    pEVar1 = *ppEVar12;
    name._M_dataplus._M_p = (pointer)&name.field_2;
    name._M_string_length = 0;
    name.field_2._M_allocated_capacity = name.field_2._M_allocated_capacity & 0xffffffffffffff00;
    lVar13 = 0;
    __x = false;
    __x_00 = false;
    local_134 = 0;
    for (lVar15 = 0;
        pbVar2 = (pEVar1->attr).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        lVar15 < (int)((ulong)((long)(pEVar1->attr).
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) >> 5
                      ); lVar15 = lVar15 + 1) {
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ((long)&(pbVar2->_M_dataplus)._M_p + lVar13);
      bVar7 = std::operator==(__lhs,"name");
      if (bVar7) {
        std::__cxx11::string::_M_assign((string *)&name);
      }
      else {
        bVar7 = std::operator==(__lhs,"typelock");
        if (bVar7) {
          __x = xml_readbool((string *)
                             ((long)&(((pEVar1->value).
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                             + lVar13));
        }
        else {
          bVar7 = std::operator==(__lhs,"namelock");
          if (bVar7) {
            __x_00 = xml_readbool((string *)
                                  ((long)&(((pEVar1->value).
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)
                                          ._M_p + lVar13));
          }
          else {
            bVar7 = std::operator==(__lhs,"indirectstorage");
            if (bVar7) {
              bVar7 = xml_readbool((string *)
                                   ((long)&(((pEVar1->value).
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus
                                           )._M_p + lVar13));
              uVar11 = local_134 | 0x10000000;
            }
            else {
              bVar7 = std::operator==(__lhs,"hiddenretparm");
              if (!bVar7) goto LAB_00297458;
              bVar7 = xml_readbool((string *)
                                   ((long)&(((pEVar1->value).
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus
                                           )._M_p + lVar13));
              uVar11 = local_134 | 0x20000000;
            }
            if (bVar7 != false) {
              local_134 = uVar11;
            }
          }
        }
      }
LAB_00297458:
      lVar13 = lVar13 + 0x20;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&namelist,&name);
    std::vector<bool,_std::allocator<bool>_>::push_back(&typelocklist,__x);
    std::vector<bool,_std::allocator<bool>_>::push_back(&namelocklist,__x_00);
    local_58.type = (Datatype *)0x0;
    local_58.flags = 0;
    local_58._28_4_ = 0;
    local_58.addr.base = (AddrSpace *)0x0;
    local_58.addr.offset = 0;
    std::vector<ParameterPieces,_std::allocator<ParameterPieces>_>::emplace_back<ParameterPieces>
              (&pieces,&local_58);
    pPVar5 = pieces.super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>._M_impl.
             super__Vector_impl_data._M_finish;
    ppEVar3 = (pEVar1->children).super__Vector_base<Element_*,_std::allocator<Element_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    Address::restoreXml(&local_58.addr,*ppEVar3,&manage->super_AddrSpaceManager);
    pPVar5[-1].addr.base = local_58.addr.base;
    pPVar5[-1].addr.offset = local_58.addr.offset;
    pDVar9 = TypeFactory::restoreXmlType(manage->types,ppEVar3[1]);
    pPVar5[-1].type = pDVar9;
    pPVar5[-1].flags = local_134;
    pAVar4 = pPVar5[-1].addr.base;
    std::vector<bool,_std::allocator<bool>_>::push_back(&typelocklist,__x);
    std::vector<bool,_std::allocator<bool>_>::push_back(&namelocklist,__x_00);
    bVar6 = (bool)(bVar6 & pAVar4 != (AddrSpace *)0x0);
    std::__cxx11::string::~string((string *)&name);
    ppEVar12 = ppEVar12 + 1;
  } while( true );
}

Assistant:

void ProtoStoreInternal::restoreXml(const Element *el,ProtoModel *model)

{
  if (el->getName() != "internallist")
    throw LowlevelError("Mismatched ProtoStore tag: ProtoStoreInternal did not get <internallist>");
  Architecture *glb = model->getArch();
  const List &list(el->getChildren());
  List::const_iterator iter;
  vector<ParameterPieces> pieces;
  vector<string> namelist;
  vector<bool> typelocklist;
  vector<bool> namelocklist;
  bool addressesdetermined = true;

  pieces.push_back( ParameterPieces() ); // Push on placeholder for output pieces
  namelist.push_back("ret");
  typelocklist.push_back(outparam->isTypeLocked());
  namelocklist.push_back(false);
  pieces.back().type = outparam->getType();
  pieces.back().flags = 0;
  if (outparam->isIndirectStorage())
    pieces.back().flags |= Varnode::indirectstorage;
  if (outparam->getAddress().isInvalid())
    addressesdetermined = false;

  for(iter=list.begin();iter!=list.end();++iter) { // This is only the input params
    const Element *subel = *iter;
    string name;
    bool typelock = false;
    bool namelock = false;
    uint4 flags = 0;
    for(int4 i=0;i<subel->getNumAttributes();++i) {
      const string &attr( subel->getAttributeName(i) );
      if (attr == "name")
	name = subel->getAttributeValue(i);
      else if (attr == "typelock")
	typelock = xml_readbool(subel->getAttributeValue(i));
      else if (attr == "namelock")
	namelock = xml_readbool(subel->getAttributeValue(i));
      else if (attr == "indirectstorage") {
	if (xml_readbool(subel->getAttributeValue(i)))
	  flags |= Varnode::indirectstorage;
      }
      else if (attr == "hiddenretparm") {
	if (xml_readbool(subel->getAttributeValue(i)))
	  flags |= Varnode::hiddenretparm;
      }
    }
    namelist.push_back(name);
    typelocklist.push_back(typelock);
    namelocklist.push_back(namelock);
    pieces.push_back(ParameterPieces());
    ParameterPieces &curparam( pieces.back() );
    const List &sublist(subel->getChildren());
    List::const_iterator subiter;
    subiter = sublist.begin();
    curparam.addr = Address::restoreXml(*subiter,glb);
    ++subiter;
    curparam.type = glb->types->restoreXmlType(*subiter);
    curparam.flags = flags;
    if (curparam.addr.isInvalid())
      addressesdetermined = false;
    typelocklist.push_back(typelock);
    namelocklist.push_back(namelock);
  }
  ProtoParameter *curparam;
  if (!addressesdetermined) {
    // If addresses for parameters are not provided, use
    // the model to derive them from type info
    vector<Datatype *> typelist;
    for(int4 i=0;i<pieces.size();++i) // Save off the restored types
      typelist.push_back( pieces[i].type );
    pieces.clear();		// throw out any other piece information
    model->assignParameterStorage(typelist,pieces,true);
    if (pieces[0].addr.isInvalid()) {	// If could not get valid storage for output
      typelocklist[0] = false;		// Treat as unlocked void
    }
    curparam = setOutput(pieces[0]);
    curparam->setTypeLock(typelocklist[0]);
  }
  uint4 j=1;
  for(uint4 i=1;i<pieces.size();++i) {
    if ((pieces[i].flags&Varnode::hiddenretparm)!=0) {
       curparam = setInput(i-1,"rethidden",pieces[i]);
       curparam->setTypeLock(typelocklist[0]);   // Has output's typelock
       continue;    // increment i but not j
    }
    curparam = setInput(i-1,namelist[j],pieces[i]);
    curparam->setTypeLock(typelocklist[j]);
    curparam->setNameLock(namelocklist[j]);
    j = j + 1;
  }
}